

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall
libtorrent::upnp::on_upnp_xml
          (upnp *this,error_code *e,http_parser *p,rootdevice *d,http_connection *c)

{
  resolver *__args_1;
  _Prime_rehash_policy _Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  char *pcVar6;
  size_type __len;
  ulong uVar7;
  pointer __rhs;
  error_code *ec_00;
  element_type *peVar8;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *callback;
  double dVar9;
  string_view input;
  span<const_char> sVar10;
  string_view url;
  string_view url_00;
  bool local_661;
  bool local_601;
  resolver_flags local_5f2 [2];
  optional<libtorrent::aux::bind_info_t> local_5f0;
  int local_5a4;
  duration<long,_std::ratio<1L,_1L>_> local_5a0;
  time_duration local_598;
  context *local_590;
  function<bool_(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_588;
  function<bool_(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_568;
  reference_wrapper<libtorrent::upnp::rootdevice> local_548;
  undefined1 local_540 [32];
  type local_520;
  undefined1 local_4f1;
  reference_wrapper<libtorrent::upnp::rootdevice> local_4f0;
  undefined1 local_4e8 [32];
  type local_4c8;
  io_context local_4a0;
  string local_490;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_470;
  _Prime_rehash_policy local_448;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  array<char,_22UL> local_3ae;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2f8;
  undefined1 local_2d0 [16];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  undefined1 local_238 [8];
  error_code ec;
  string auth;
  string protocol;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  __normal_iterator<char_const*,std::__cxx11::string> local_1b0 [15];
  byte local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  parse_state *local_180;
  code *local_178;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::parse_state>))(int,_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::parse_state_&)>
  local_170;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_160;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  undefined1 local_130 [8];
  span<const_char> body;
  parse_state s;
  error_code local_60;
  char local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<libtorrent::upnp> me;
  http_connection *c_local;
  rootdevice *d_local;
  http_parser *p_local;
  error_code *e_local;
  upnp *this_local;
  
  me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)c;
  self((upnp *)local_40);
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&d->upnp_connection);
  if ((bVar2) &&
     (peVar5 = ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::
               get(&(d->upnp_connection).
                    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                  ),
     peVar5 == (element_type *)
               me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
     )) {
    peVar8 = ::std::
             __shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&d->upnp_connection);
    libtorrent::aux::http_connection::close(peVar8,0);
    ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(d->upnp_connection).
                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>);
  }
  _Var1._M_next_resize = local_448._M_next_resize;
  _Var1._M_max_load_factor = local_448._M_max_load_factor;
  _Var1._4_4_ = local_448._4_4_;
  if ((this->m_closing & 1U) == 0) {
    bVar2 = boost::system::error_code::operator_cast_to_bool(e);
    local_601 = false;
    if (bVar2) {
      boost::system::error_code::error_code<boost::asio::error::misc_errors>
                (&local_60,eof,(type *)0x0);
      local_601 = boost::system::operator!=(e,&local_60);
    }
    if (local_601 == false) {
      bVar2 = libtorrent::aux::http_parser::header_finished(p);
      if (bVar2) {
        iVar3 = libtorrent::aux::http_parser::status_code(p);
        if (iVar3 == 200) {
          parse_state::parse_state((parse_state *)&body.m_len);
          sVar10 = libtorrent::aux::http_parser::get_body(p);
          body.m_ptr = (char *)sVar10.m_len;
          local_130 = (undefined1  [8])sVar10.m_ptr;
          pcVar6 = span<const_char>::data((span<const_char> *)local_130);
          __len = span<const_char>::size((span<const_char> *)local_130);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_140,pcVar6,__len);
          local_178 = find_control_url;
          local_180 = (parse_state *)::std::ref<libtorrent::parse_state>((parse_state *)&body.m_len)
          ;
          callback = (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)&::std::placeholders::_2;
          ec_00 = (error_code *)&local_180;
          ::std::
          bind<void(*)(int,std::basic_string_view<char,std::char_traits<char>>,libtorrent::parse_state&),std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::reference_wrapper<libtorrent::parse_state>>
                    (&local_170._M_f,(_Placeholder<1> *)&local_178,
                     (_Placeholder<2> *)&::std::placeholders::_1,
                     (reference_wrapper<libtorrent::parse_state> *)&::std::placeholders::_2);
          ::std::
          function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
          ::
          function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::parse_state>))(int,std::basic_string_view<char,std::char_traits<char>>,libtorrent::parse_state&)>,void>
                    ((function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
                      *)&local_160,&local_170);
          input._M_str = (char *)&local_160;
          input._M_len = (size_t)local_140._M_str;
          libtorrent::aux::xml_parse((aux *)local_140._M_len,input,callback);
          ::std::
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          ::~function(&local_160);
          uVar7 = ::std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            ::std::__cxx11::string::operator=
                      ((string *)&d->service_namespace,
                       (string *)(s.control_url.field_2._M_local_buf + 8));
            uVar7 = ::std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              ::std::__cxx11::string::operator=
                        ((string *)&this->m_model,
                         (string *)(s.service_type.field_2._M_local_buf + 8));
            }
            uVar4 = ::std::__cxx11::string::empty();
            local_1a1 = 0;
            local_661 = false;
            if ((uVar4 & 1) == 0) {
              ::std::__cxx11::string::substr
                        ((ulong)&local_1a0,
                         (ulong)&s.tag_stack.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_1a1 = 1;
              local_661 = ::std::operator!=(&local_1a0,"http://");
            }
            if ((local_1a1 & 1) != 0) {
              ::std::__cxx11::string::~string((string *)&local_1a0);
            }
            if (local_661 == false) {
              ::std::__cxx11::string::operator=
                        ((string *)&d->control_url,
                         (string *)
                         &s.tag_stack.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ::std::__cxx11::string::size();
              pcVar6 = (char *)::std::__cxx11::string::operator[]
                                         ((ulong)((long)&s.model.field_2 + 8));
              if (((*pcVar6 == '/') && (uVar7 = ::std::__cxx11::string::empty(), (uVar7 & 1) == 0))
                 && (pcVar6 = (char *)::std::__cxx11::string::operator[]
                                                ((ulong)&s.tag_stack.
                                                                                                                  
                                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                ), *pcVar6 == '/')) {
                local_1c0._M_current = (char *)::std::__cxx11::string::end();
                local_1b8 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator-(&local_1c0,1);
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>(local_1b0,&local_1b8);
                ::std::__cxx11::string::erase
                          ((undefined1 *)((long)&s.model.field_2 + 8),local_1b0._0_8_);
              }
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&protocol.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&s.model.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &s.tag_stack.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::operator=
                        ((string *)&d->control_url,(string *)(protocol.field_2._M_local_buf + 8));
              ::std::__cxx11::string::~string((string *)(protocol.field_2._M_local_buf + 8));
            }
            ::std::__cxx11::string::string((string *)(auth.field_2._M_local_buf + 8));
            ::std::__cxx11::string::string((string *)&ec.cat_);
            boost::system::error_code::error_code((error_code *)local_238);
            uVar7 = ::std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)&d->control_url);
              if (*pcVar6 == '/') {
                local_2d0 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)d);
                url._M_len = local_2d0._8_8_;
                url._M_str = local_238;
                libtorrent::aux::parse_url_components_abi_cxx11_
                          (&local_2c0,local_2d0._0_8_,url,ec_00);
                ec_00 = (error_code *)&d->port;
                ::std::
                tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
                          (&local_2f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&auth.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ec.cat_,&d->hostname,(int *)ec_00,&d->path);
                ::std::
                tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                             *)&local_2f8,&local_2c0);
                ::std::
                tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~tuple(&local_2c0);
                if (d->port == -1) {
                  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&auth.field_2 + 8),"http");
                  iVar3 = 0x1bb;
                  if (bVar2) {
                    iVar3 = 0x50;
                  }
                  d->port = iVar3;
                }
                ::std::operator+(&local_398,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&auth.field_2 + 8),"://");
                ::std::operator+(&local_378,&local_398,&d->hostname);
                ::std::operator+(&local_358,&local_378,":");
                libtorrent::aux::to_string(&local_3ae,(long)d->port);
                __rhs = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_3ae);
                ::std::operator+(&local_338,&local_358,__rhs);
                ::std::operator+(&local_318,&local_338,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&s.tag_stack.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::__cxx11::string::operator=((string *)&d->control_url,(string *)&local_318);
                ::std::__cxx11::string::~string((string *)&local_318);
                ::std::__cxx11::string::~string((string *)&local_338);
                ::std::__cxx11::string::~string((string *)&local_358);
                ::std::__cxx11::string::~string((string *)&local_378);
                ::std::__cxx11::string::~string((string *)&local_398);
              }
            }
            bVar2 = should_log(this);
            if (bVar2) {
              ::std::__cxx11::string::c_str();
              ::std::__cxx11::string::c_str();
              ec_00 = (error_code *)::std::__cxx11::string::c_str();
              dVar9 = (double)::std::__cxx11::string::c_str();
              log(this,dVar9);
            }
            local_448 = (_Prime_rehash_policy)
                        ::std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&d->control_url);
            url_00._M_len = local_448._M_next_resize;
            url_00._M_str = local_238;
            libtorrent::aux::parse_url_components_abi_cxx11_
                      (&local_438,local_448._0_8_,url_00,ec_00);
            ::std::
            tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
                      (&local_470,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&auth.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec.cat_
                       ,&d->hostname,&d->port,&d->path);
            ::std::
            tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
            ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                         *)&local_470,&local_438);
            ::std::
            tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~tuple(&local_438);
            if (d->port == -1) {
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&auth.field_2 + 8),"http");
              iVar3 = 0x1bb;
              if (bVar2) {
                iVar3 = 0x50;
              }
              d->port = iVar3;
            }
            bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)local_238);
            if (bVar2) {
              bVar2 = should_log(this);
              if (bVar2) {
                ::std::__cxx11::string::c_str();
                boost::system::error_code::message_abi_cxx11_(&local_490,(error_code *)local_238);
                dVar9 = (double)::std::__cxx11::string::c_str();
                log(this,dVar9);
                ::std::__cxx11::string::~string((string *)&local_490);
              }
              d->disabled = true;
              local_50[0] = '\x01';
              local_50[1] = '\0';
              local_50[2] = '\0';
              local_50[3] = '\0';
            }
            else {
              bVar2 = ::std::__shared_ptr::operator_cast_to_bool
                                ((__shared_ptr *)&d->upnp_connection);
              if (bVar2) {
                peVar8 = ::std::
                         __shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&d->upnp_connection);
                libtorrent::aux::http_connection::close(peVar8,0);
              }
              __args_1 = (resolver *)this->m_io_service;
              local_4e8._16_8_ = on_upnp_get_ip_address_response;
              local_4e8._24_8_ = (pointer)0x0;
              self((upnp *)local_4e8);
              local_4f0 = ::std::ref<libtorrent::upnp::rootdevice>(d);
              ::std::
              bind<void(libtorrent::upnp::*)(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::upnp::rootdevice&,libtorrent::aux::http_connection&),std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::reference_wrapper<libtorrent::upnp::rootdevice>,std::_Placeholder<4>const&>
                        ((type *)(local_4e8 + 0x20),(offset_in_upnp_to_subr *)(local_4e8 + 0x10),
                         (shared_ptr<libtorrent::upnp> *)local_4e8,
                         (_Placeholder<1> *)&::std::placeholders::_1,
                         (_Placeholder<2> *)&::std::placeholders::_2,&local_4f0,
                         (_Placeholder<4> *)&::std::placeholders::_4);
              local_4f1 = 1;
              local_540._16_8_ = get_ip_address;
              local_540._24_8_ = (pointer)0x0;
              self((upnp *)local_540);
              local_548 = ::std::ref<libtorrent::upnp::rootdevice>(d);
              ::std::
              bind<void(libtorrent::upnp::*)(libtorrent::upnp::rootdevice&),std::shared_ptr<libtorrent::upnp>,std::reference_wrapper<libtorrent::upnp::rootdevice>>
                        ((type *)(local_540 + 0x20),(offset_in_upnp_to_subr *)(local_540 + 0x10),
                         (shared_ptr<libtorrent::upnp> *)local_540,&local_548);
              ::std::
              function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
              ::function((function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                          *)&local_568);
              ::std::
              function<bool_(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
              ::function(&local_588);
              local_590 = &this->m_ssl_ctx;
              ::std::
              make_shared<libtorrent::aux::http_connection,boost::asio::io_context&,libtorrent::aux::resolver&,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>,std::_Placeholder<2>,std::reference_wrapper<libtorrent::upnp::rootdevice>,std::_Placeholder<4>))(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::upnp::rootdevice&,libtorrent::aux::http_connection&)>,bool,int_const&,std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice&)>,std::function<void(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&)>,std::function<bool(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>)>,boost::asio::ssl::context*>
                        (&local_4a0,__args_1,
                         (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::upnp::rootdevice>,_std::_Placeholder<4>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::upnp::rootdevice_&,_libtorrent::aux::http_connection_&)>
                          *)&this->m_resolver,(bool *)(local_4e8 + 0x20),(int *)&local_4f1,
                         (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice_&)>
                          *)&libtorrent::aux::default_max_bottled_buffer_size,
                         (function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                          *)(local_540 + 0x20),&local_568,(context **)&local_588);
              ::std::shared_ptr<libtorrent::aux::http_connection>::operator=
                        (&d->upnp_connection,
                         (shared_ptr<libtorrent::aux::http_connection> *)&local_4a0);
              ::std::shared_ptr<libtorrent::aux::http_connection>::~shared_ptr
                        ((shared_ptr<libtorrent::aux::http_connection> *)&local_4a0);
              ::std::
              function<bool_(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
              ::~function(&local_588);
              ::std::
              function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
              ::~function((function<void_(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
                           *)&local_568);
              ::std::
              _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice_&)>
              ::~_Bind((_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::reference_wrapper<libtorrent::upnp::rootdevice>))(libtorrent::upnp::rootdevice_&)>
                        *)(local_540 + 0x20));
              ::std::shared_ptr<libtorrent::upnp>::~shared_ptr
                        ((shared_ptr<libtorrent::upnp> *)local_540);
              ::std::
              _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::upnp::rootdevice>,_std::_Placeholder<4>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::upnp::rootdevice_&,_libtorrent::aux::http_connection_&)>
              ::~_Bind((_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::reference_wrapper<libtorrent::upnp::rootdevice>,_std::_Placeholder<4>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::upnp::rootdevice_&,_libtorrent::aux::http_connection_&)>
                        *)(local_4e8 + 0x20));
              ::std::shared_ptr<libtorrent::upnp>::~shared_ptr
                        ((shared_ptr<libtorrent::upnp> *)local_4e8);
              peVar8 = ::std::
                       __shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&d->upnp_connection);
              iVar3 = d->port;
              local_5a4 = 10;
              ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1l>> *)&local_5a0,&local_5a4);
              ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
              duration<long,std::ratio<1l,1l>,void>
                        ((duration<long,std::ratio<1l,1000000000l>> *)&local_598,&local_5a0);
              ::std::optional<libtorrent::aux::bind_info_t>::optional();
              libtorrent::flags::
              bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>::bitfield_flag
                        (local_5f2);
              libtorrent::aux::http_connection::start
                        (peVar8,&d->hostname,iVar3,local_598,(proxy_settings *)0x0,false,5,
                         &local_5f0,local_5f2[0],(i2p_connection *)0x0);
              ::std::optional<libtorrent::aux::bind_info_t>::~optional(&local_5f0);
              local_50[0] = '\0';
              local_50[1] = '\0';
              local_50[2] = '\0';
              local_50[3] = '\0';
            }
            ::std::__cxx11::string::~string((string *)&ec.cat_);
            ::std::__cxx11::string::~string((string *)(auth.field_2._M_local_buf + 8));
          }
          else {
            dVar9 = (double)::std::__cxx11::string::c_str();
            log(this,dVar9);
            d->disabled = true;
            local_50[0] = '\x01';
            local_50[1] = '\0';
            local_50[2] = '\0';
            local_50[3] = '\0';
          }
          parse_state::~parse_state((parse_state *)&body.m_len);
        }
        else {
          bVar2 = should_log(this);
          if (bVar2) {
            ::std::__cxx11::string::c_str();
            libtorrent::aux::http_parser::message_abi_cxx11_(p);
            dVar9 = (double)::std::__cxx11::string::c_str();
            log(this,dVar9);
          }
          d->disabled = true;
          local_50[0] = '\x01';
          local_50[1] = '\0';
          local_50[2] = '\0';
          local_50[3] = '\0';
        }
      }
      else {
        dVar9 = (double)::std::__cxx11::string::c_str();
        log(this,dVar9);
        d->disabled = true;
        local_50[0] = '\x01';
        local_50[1] = '\0';
        local_50[2] = '\0';
        local_50[3] = '\0';
      }
    }
    else {
      bVar2 = should_log(this);
      if (bVar2) {
        ::std::__cxx11::string::c_str();
        boost::system::error_code::message_abi_cxx11_((string *)((long)&s.url_base.field_2 + 8),e);
        dVar9 = (double)::std::__cxx11::string::c_str();
        log(this,dVar9);
        ::std::__cxx11::string::~string((string *)(s.url_base.field_2._M_local_buf + 8));
      }
      d->disabled = true;
      local_50[0] = '\x01';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
    }
  }
  else {
    local_50[0] = '\x01';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_448 = _Var1;
  }
  ::std::shared_ptr<libtorrent::upnp>::~shared_ptr((shared_ptr<libtorrent::upnp> *)local_40);
  return;
}

Assistant:

void upnp::on_upnp_xml(error_code const& e
	, aux::http_parser const& p, rootdevice& d
	, aux::http_connection& c)
{
	TORRENT_ASSERT(is_single_thread());
	std::shared_ptr<upnp> me(self());

	TORRENT_ASSERT(d.magic == 1337);
	if (d.upnp_connection && d.upnp_connection.get() == &c)
	{
		d.upnp_connection->close();
		d.upnp_connection.reset();
	}

	if (m_closing) return;

	if (e && e != boost::asio::error::eof)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while fetching control url from: %s: %s"
				, d.url.c_str(), e.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("error while fetching control url from: %s: incomplete HTTP message"
			, d.url.c_str());
#endif
		d.disabled = true;
		return;
	}

	if (p.status_code() != 200)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error while fetching control url from: %s: %s"
				, d.url.c_str(), p.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	parse_state s;
	auto body = p.get_body();
	xml_parse({body.data(), std::size_t(body.size())}, std::bind(&find_control_url, _1, _2, std::ref(s)));
	if (s.control_url.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("could not find a port mapping interface in response from: %s"
			, d.url.c_str());
#endif
		d.disabled = true;
		return;
	}
	d.service_namespace = s.service_type;

	TORRENT_ASSERT(!d.service_namespace.empty());

	if (!s.model.empty()) m_model = s.model;

	if (!s.url_base.empty() && s.control_url.substr(0, 7) != "http://")
	{
		// avoid double slashes in path
		if (s.url_base[s.url_base.size()-1] == '/'
			&& !s.control_url.empty()
			&& s.control_url[0] == '/')
			s.url_base.erase(s.url_base.end()-1);
		d.control_url = s.url_base + s.control_url;
	}
	else d.control_url = s.control_url;

	std::string protocol;
	std::string auth;
	error_code ec;
	if (!d.control_url.empty() && d.control_url[0] == '/')
	{
		std::tie(protocol, auth, d.hostname, d.port, d.path)
			= parse_url_components(d.url, ec);
		if (d.port == -1) d.port = protocol == "http" ? 80 : 443;
		d.control_url = protocol + "://" + d.hostname + ":"
			+ to_string(d.port).data() + s.control_url;
	}

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("found control URL: %s namespace %s "
			"urlbase: %s in response from %s"
			, d.control_url.c_str(), d.service_namespace.c_str()
			, s.url_base.c_str(), d.url.c_str());
	}
#endif

	std::tie(protocol, auth, d.hostname, d.port, d.path)
		= parse_url_components(d.control_url, ec);
	if (d.port == -1) d.port = protocol == "http" ? 80 : 443;

	if (ec)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("failed to parse URL '%s': %s"
				, d.control_url.c_str(), ec.message().c_str());
		}
#endif
		d.disabled = true;
		return;
	}

	if (d.upnp_connection) d.upnp_connection->close();
	d.upnp_connection = std::make_shared<http_connection>(m_io_service
		, m_resolver
		, std::bind(&upnp::on_upnp_get_ip_address_response, self(), _1, _2
			, std::ref(d), _4), true, default_max_bottled_buffer_size
		, std::bind(&upnp::get_ip_address, self(), std::ref(d))
		, http_filter_handler()
		, hostname_filter_handler()
#if TORRENT_USE_SSL
		, &m_ssl_ctx
#endif
		);
	d.upnp_connection->start(d.hostname, d.port, seconds(10));
}